

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  undefined1 uVar1;
  bool bVar2;
  CppType CVar3;
  int iVar4;
  Message *message_00;
  Message *pMVar5;
  MapFieldBase *pMVar6;
  int j;
  int size;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  FieldDescriptor *field;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  MapIterator *in_stack_fffffffffffffef8;
  Reflection *in_stack_ffffffffffffff00;
  FieldDescriptor *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Reflection *in_stack_ffffffffffffff18;
  MapFieldBase *in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3a;
  Reflection *this;
  int local_b0;
  undefined1 local_a8 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffff60;
  FieldDescriptor *in_stack_ffffffffffffff68;
  Reflection *in_stack_ffffffffffffff70;
  Reflection *in_stack_ffffffffffffff78;
  undefined1 local_78 [8];
  MapValueRef *in_stack_ffffffffffffff90;
  Message *in_stack_ffffffffffffffa0;
  int local_38;
  FieldDescriptor *in_stack_ffffffffffffffd0;
  Descriptor *in_stack_ffffffffffffffd8;
  MapIterator *in_stack_ffffffffffffffe0;
  
  GetReflectionOrDie(in_stack_ffffffffffffffa0);
  Reflection::MutableUnknownFields(in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8);
  UnknownFieldSet::Clear((UnknownFieldSet *)in_stack_ffffffffffffff00);
  this = (Reflection *)&stack0xffffffffffffffd8;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x431d23);
  Reflection::ListFields
            (in_stack_ffffffffffffff70,(Message *)in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
  local_38 = 0;
  while( true ) {
    message_00 = (Message *)(long)local_38;
    pMVar5 = (Message *)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&stack0xffffffffffffffd8);
    if (pMVar5 <= message_00) break;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&stack0xffffffffffffffd8,(long)local_38);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x431da2);
    if (CVar3 == CPPTYPE_MESSAGE) {
      uVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_ffffffffffffff00);
      if (((bool)uVar1) &&
         (in_stack_ffffffffffffff3a = IsMapValueMessageTyped((FieldDescriptor *)0x431dfc),
         (bool)in_stack_ffffffffffffff3a)) {
        pMVar6 = Reflection::MutableMapData
                           ((Reflection *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (Message *)in_stack_ffffffffffffff08,
                            (FieldDescriptor *)in_stack_ffffffffffffff00);
        in_stack_ffffffffffffff30 = pMVar6;
        bVar2 = MapFieldBase::IsMapValid((MapFieldBase *)in_stack_ffffffffffffff00);
        if (bVar2) {
          MapIterator::MapIterator
                    (in_stack_ffffffffffffffe0,(Message *)in_stack_ffffffffffffffd8,
                     in_stack_ffffffffffffffd0);
          MapIterator::MapIterator
                    (in_stack_ffffffffffffffe0,(Message *)in_stack_ffffffffffffffd8,
                     in_stack_ffffffffffffffd0);
          (*pMVar6->_vptr_MapFieldBase[6])(pMVar6,local_78);
          (*pMVar6->_vptr_MapFieldBase[7])(pMVar6,local_a8);
          while (bVar2 = protobuf::operator!=
                                   ((MapIterator *)in_stack_ffffffffffffff00,
                                    in_stack_fffffffffffffef8), bVar2) {
            MapIterator::MutableValueRef((MapIterator *)in_stack_ffffffffffffff00);
            in_stack_ffffffffffffff18 =
                 (Reflection *)MapValueRef::MutableMessageValue(in_stack_ffffffffffffff90);
            (*((MessageLite *)&in_stack_ffffffffffffff18->descriptor_)->_vptr_MessageLite[0x12])();
            MapIterator::operator++((MapIterator *)in_stack_ffffffffffffff00);
          }
          MapIterator::~MapIterator((MapIterator *)in_stack_ffffffffffffff00);
          MapIterator::~MapIterator((MapIterator *)in_stack_ffffffffffffff00);
        }
      }
      else {
        bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x431fb3);
        in_stack_ffffffffffffff14 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff14);
        if (bVar2) {
          iVar4 = Reflection::FieldSize
                            (in_stack_ffffffffffffff78,(Message *)in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff68);
          in_stack_ffffffffffffff10 = iVar4;
          for (local_b0 = 0; local_b0 < iVar4; local_b0 = local_b0 + 1) {
            in_stack_ffffffffffffff08 =
                 (FieldDescriptor *)
                 Reflection::MutableRepeatedMessage
                           (in_stack_ffffffffffffff18,
                            (Message *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                            ,in_stack_ffffffffffffff08,
                            (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
            (**(code **)((long)*(MessageLite *)in_stack_ffffffffffffff08 + 0x90))();
          }
        }
        else {
          in_stack_ffffffffffffff00 =
               (Reflection *)
               Reflection::MutableMessage
                         (this,message_00,
                          (FieldDescriptor *)
                          CONCAT44(CVar3,CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffff3a,
                                                                 in_stack_ffffffffffffff38))),
                          (MessageFactory *)in_stack_ffffffffffffff30);
          (*((MessageLite *)&in_stack_ffffffffffffff00->descriptor_)->_vptr_MessageLite[0x12])();
        }
      }
    }
    local_38 = local_38 + 1;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return;
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  reflection->MutableUnknownFields(message)->Clear();

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    if (field->is_map() && IsMapValueMessageTyped(field)) {
      const MapFieldBase* map_field =
          reflection->MutableMapData(message, field);
      if (map_field->IsMapValid()) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}